

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O1

void __thiscall quantum::QuantumComputer::displayInfo(QuantumComputer *this)

{
  pointer pdVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pdVar5;
  ulong uVar6;
  char *pcVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*****",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Information about state",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current register size(qubits): ",0x1f);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->registerSize);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Register is normalized: ",0x18);
  pcVar7 = "false";
  pcVar4 = "false";
  if ((ulong)this->isNormalize != 0) {
    pcVar4 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar4,(ulong)this->isNormalize ^ 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Register is measured: ",0x16);
  if ((ulong)this->isMeasured != 0) {
    pcVar7 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar7,(ulong)this->isMeasured ^ 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Size of baseVector: ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Values in baseVector array: ",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  pdVar5 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar1) {
    uVar6 = 0;
    do {
      printf("  index [%d] value [%.4f] \n",*pdVar5,uVar6);
      uVar6 = (ulong)((int)uVar6 + 1);
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*****",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void quantum::QuantumComputer::displayInfo() {



    std::cout << "*****" << std::endl;
    std::cout << "Information about state" << std::endl;
    std::cout << "Current register size(qubits): " << this->registerSize << std::endl;
    std::cout << "Register is normalized: " << boolToString(this->isNormalize) << std::endl;
    std::cout << "Register is measured: " << boolToString(this->isMeasured) << std::endl;
    std::cout << "Size of baseVector: " << this->baseVector.size() << std::endl;
    std::cout << "Values in baseVector array: " << std::endl;
    int i = 0;
    for (auto x: this->baseVector) {
        printf("  index [%d] value [%.4f] \n",i, x);
        i++;
    }
    std::cout << "*****" << std::endl;
}